

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btHingeConstraint.cpp
# Opt level: O0

btScalar __thiscall btHingeConstraint::getParam(btHingeConstraint *this,int num,int axis)

{
  btScalar retVal;
  int axis_local;
  int num_local;
  btHingeConstraint *this_local;
  
  retVal = 0.0;
  if ((axis == -1) || (axis == 5)) {
    switch(num) {
    case 1:
      retVal = this->m_normalERP;
      break;
    case 2:
      retVal = this->m_stopERP;
      break;
    case 3:
      retVal = this->m_normalCFM;
      break;
    case 4:
      retVal = this->m_stopCFM;
    }
  }
  return retVal;
}

Assistant:

btScalar btHingeConstraint::getParam(int num, int axis) const 
{
	btScalar retVal = 0;
	if((axis == -1) || (axis == 5))
	{
		switch(num)
		{	
			case BT_CONSTRAINT_STOP_ERP :
				btAssertConstrParams(m_flags & BT_HINGE_FLAGS_ERP_STOP);
				retVal = m_stopERP;
				break;
			case BT_CONSTRAINT_STOP_CFM :
				btAssertConstrParams(m_flags & BT_HINGE_FLAGS_CFM_STOP);
				retVal = m_stopCFM;
				break;
			case BT_CONSTRAINT_CFM :
				btAssertConstrParams(m_flags & BT_HINGE_FLAGS_CFM_NORM);
				retVal = m_normalCFM;
				break;
			case BT_CONSTRAINT_ERP:
				btAssertConstrParams(m_flags & BT_HINGE_FLAGS_ERP_NORM);
				retVal = m_normalERP;
				break;
			default : 
				btAssertConstrParams(0);
		}
	}
	else
	{
		btAssertConstrParams(0);
	}
	return retVal;
}